

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_post_effects.cpp
# Opt level: O0

bool __thiscall
ON_PostEffects::MovePostEffectBefore(ON_PostEffects *this,ON_UUID *id_move,ON_UUID *id_before)

{
  bool bVar1;
  int iVar2;
  ON_PostEffect **ppOVar3;
  undefined4 extraout_var;
  long *plVar5;
  undefined8 uVar6;
  ON_XMLNode *xml_before;
  int index_before;
  ON_XMLNode *xml_move_detached;
  ON_XMLNode *parent;
  ON_XMLNode *xml_move;
  ON_PostEffect *pep_move;
  ON_SimpleArray<ON_PostEffect_*> *pel;
  ON_UUID *pOStack_28;
  int index_move;
  ON_UUID *id_before_local;
  ON_UUID *id_move_local;
  ON_PostEffects *this_local;
  long *plVar4;
  
  pOStack_28 = id_before;
  id_before_local = id_move;
  id_move_local = (ON_UUID *)this;
  bVar1 = ::operator==(id_move,id_before);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    pel._4_4_ = CImpl::IndexOfPostEffect(this->_impl,id_before_local);
    if ((int)pel._4_4_ < 0) {
      this_local._7_1_ = false;
    }
    else {
      pep_move = (ON_PostEffect *)CImpl::PostEffectList(this->_impl);
      ppOVar3 = ON_SimpleArray<ON_PostEffect_*>::operator[]
                          ((ON_SimpleArray<ON_PostEffect_*> *)pep_move,pel._4_4_);
      xml_move = (ON_XMLNode *)*ppOVar3;
      (*pep_move->_vptr_ON_PostEffect[2])(pep_move,(ulong)pel._4_4_);
      iVar2 = (*xml_move->_vptr_ON_XMLNode[0x10])();
      plVar4 = (long *)CONCAT44(extraout_var,iVar2);
      plVar5 = (long *)(**(code **)(*plVar4 + 0x40))();
      if (plVar5 == (long *)0x0) {
        this_local._7_1_ = false;
      }
      else {
        bVar1 = ON_UuidIsNil(pOStack_28);
        if (bVar1) {
          uVar6 = (**(code **)(*plVar5 + 0x88))(plVar5,plVar4);
          (**(code **)(*plVar5 + 0x58))(plVar5,uVar6);
          ON_SimpleArray<ON_PostEffect_*>::Append
                    ((ON_SimpleArray<ON_PostEffect_*> *)pep_move,(ON_PostEffect **)&xml_move);
        }
        else {
          iVar2 = CImpl::IndexOfPostEffect(this->_impl,pOStack_28);
          if (iVar2 < 0) {
            return false;
          }
          ON_SimpleArray<ON_PostEffect_*>::Insert
                    ((ON_SimpleArray<ON_PostEffect_*> *)pep_move,iVar2,(ON_PostEffect **)&xml_move);
          ppOVar3 = ON_SimpleArray<ON_PostEffect_*>::operator[]
                              ((ON_SimpleArray<ON_PostEffect_*> *)pep_move,iVar2);
          iVar2 = (*(*ppOVar3)->_vptr_ON_PostEffect[0x10])();
          (**(code **)(*plVar4 + 0xa8))(plVar4,iVar2);
        }
        this_local._7_1_ = true;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_PostEffects::MovePostEffectBefore(const ON_UUID& id_move, const ON_UUID& id_before)
{
  if (id_move == id_before)
    return false;

  const int index_move = _impl->IndexOfPostEffect(id_move);
  if (index_move < 0)
    return false;

  auto& pel = _impl->PostEffectList();

  ON_PostEffect* pep_move = pel[index_move];
  pel.Remove(index_move);

  ON_XMLNode& xml_move = pep_move->XMLNode();

  ON_XMLNode* parent = xml_move.Parent();
  if (nullptr == parent)
    return false; // Should never happen.

  if (ON_UuidIsNil(id_before))
  {
    ON_XMLNode* xml_move_detached = parent->DetachChild(xml_move);
    parent->AttachChildNode(xml_move_detached);
    pel.Append(pep_move);
  }
  else
  {
    const int index_before = _impl->IndexOfPostEffect(id_before);
    if (index_before < 0)
      return false;

    pel.Insert(index_before, pep_move);

    ON_XMLNode& xml_before = pel[index_before]->XMLNode();
    xml_move.MoveBefore(xml_before);
  }

  return true;
}